

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O3

string * METADemuxer::mplsTrackToFullName
                   (string *__return_storage_ptr__,string *mplsFileName,string *mplsNum)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  undefined8 uVar11;
  ulong uVar12;
  string m2tsExt;
  string mplsExt;
  string path;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined8 uStack_98;
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  extractFilePath(&local_90,mplsFileName);
  toNativeSeparators(&local_50,&local_90);
  paVar2 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  cVar5 = getDirSeparator();
  lVar7 = std::__cxx11::string::rfind((char)&local_50,(ulong)(uint)(int)cVar5);
  if (lVar7 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_001a587d;
  }
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_50);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"STREAM","");
  uVar12 = 0xf;
  if (local_b0 != &local_a0) {
    uVar12 = local_a0;
  }
  if (uVar12 < local_d0._M_string_length + local_a8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar11 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_d0._M_string_length + local_a8) goto LAB_001a54fb;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_001a54fb:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_f0.field_2._M_allocated_capacity = *psVar10;
    local_f0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar10;
    local_f0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_f0._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  getDirSeparator();
  plVar9 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_f0,local_f0._M_string_length,0,'\x01');
  psVar10 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_90.field_2._M_allocated_capacity = *psVar10;
    local_90.field_2._8_8_ = plVar9[3];
    local_90._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar10;
    local_90._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_90._M_string_length = plVar9[1];
  *plVar9 = (long)psVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  extractFileExt(&local_f0,mplsFileName);
  strToLowerCase(&local_90,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_90);
  pcVar4 = ".mts";
  if (iVar6 == 0) {
    pcVar4 = ".m2ts";
  }
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,pcVar4 + 1,pcVar4 + 1 + (ulong)(iVar6 == 0) + 3);
  std::operator+(&local_d0,&local_50,mplsNum);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".","");
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar11 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_68 + local_d0._M_string_length) {
    uVar12 = 0xf;
    if (local_70 != local_60) {
      uVar12 = local_60[0];
    }
    if (uVar12 < local_68 + local_d0._M_string_length) goto LAB_001a574b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_70,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
  }
  else {
LAB_001a574b:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_70);
  }
  puVar1 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar8[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (ulong *)*puVar8;
  }
  local_a8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)local_f0._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar10) {
    lVar7 = plVar9[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar9[1];
  *plVar9 = (long)psVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_001a587d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string METADemuxer::mplsTrackToFullName(const std::string& mplsFileName, const std::string& mplsNum)
{
    string path = toNativeSeparators(extractFilePath(mplsFileName));
    const size_t tmp = path.find_last_of(getDirSeparator());
    if (tmp == string::npos)
        return {};
    path = path.substr(0, tmp + 1) + string("STREAM") + getDirSeparator();

    const string mplsExt = strToLowerCase(extractFileExt(mplsFileName));
    const string m2tsExt = (mplsExt == "mpls") ? "m2ts" : "mts";

    return path + mplsNum + string(".") + m2tsExt;
}